

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

void NJamSpell::ToLower(wstring *text)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  wstring *text_local;
  
  uVar1 = std::__cxx11::wstring::begin();
  uVar2 = std::__cxx11::wstring::end();
  uVar3 = std::__cxx11::wstring::begin();
  std::
  transform<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,NJamSpell::ToLower(std::__cxx11::wstring&)::__0>
            (uVar1,uVar2,uVar3);
  return;
}

Assistant:

void ToLower(std::wstring& text) {
    std::transform(text.begin(), text.end(), text.begin(), [](wchar_t wch) {
        return GWctype.tolower(wch);
    });
}